

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

float __thiscall
QuantizeData::compute_kl_divergence
          (QuantizeData *this,vector<float,_std::allocator<float>_> *dist_a,
          vector<float,_std::allocator<float>_> *dist_b)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  uVar3 = (ulong)((long)(dist_a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(dist_a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar2 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  fVar6 = 0.0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    fVar1 = (dist_a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      fVar5 = (dist_b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar2];
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        fVar5 = logf(fVar1 / fVar5);
        fVar6 = fVar6 + fVar5 * fVar1;
      }
      else {
        fVar6 = fVar6 + 1.0;
      }
    }
  }
  return fVar6;
}

Assistant:

float QuantizeData::compute_kl_divergence(const std::vector<float> &dist_a, const std::vector<float> &dist_b) 
{
    const int length = dist_a.size();
    assert(dist_b.size() == length);
    float result = 0;

    for (int i=0; i<length; i++) 
    {
        if (dist_a[i] != 0) 
        {
            if (dist_b[i] == 0) 
            {
                result += 1;
            } 
            else 
            {
                result += dist_a[i] * log(dist_a[i] / dist_b[i]);
            }
        }
    }

    return result;
}